

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::get_component<signed_char>(Omega_h *this,Read<signed_char> *a,Int ncomps,Int comp)

{
  int size_in;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> local_d8;
  undefined1 local_c8 [8];
  type f;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<signed_char> b;
  Int comp_local;
  Int ncomps_local;
  Read<signed_char> *a_local;
  LO local_20;
  int local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (int)((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (int)((ulong)(a->write_).shared_alloc_.alloc >> 3);
  }
  b.shared_alloc_.direct_ptr._0_4_ = comp;
  b.shared_alloc_.direct_ptr._4_4_ = ncomps;
  size_in = divide_no_remainder<int>(local_10,ncomps);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<signed_char>::Write((Write<signed_char> *)local_68,size_in,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Write<signed_char>::Write((Write<signed_char> *)local_c8,(Write<signed_char> *)local_68);
  Read<signed_char>::Read((Read<signed_char> *)&f.b.shared_alloc_.direct_ptr,a);
  f.a.write_.shared_alloc_.direct_ptr._0_4_ = b.shared_alloc_.direct_ptr._4_4_;
  f.a.write_.shared_alloc_.direct_ptr._4_4_ = (Int)b.shared_alloc_.direct_ptr;
  if (((ulong)local_68 & 1) == 0) {
    local_20 = (LO)*(size_t *)local_68;
  }
  else {
    local_20 = (LO)((ulong)local_68 >> 3);
  }
  parallel_for<Omega_h::get_component<signed_char>(Omega_h::Read<signed_char>,int,int)::_lambda(int)_1_>
            (local_20,(type *)local_c8,"get_component");
  Write<signed_char>::Write(&local_d8,(Write<signed_char> *)local_68);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_d8);
  Write<signed_char>::~Write(&local_d8);
  get_component<signed_char>(Omega_h::Read<signed_char>,int,int)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_c8);
  Write<signed_char>::~Write((Write<signed_char> *)local_68);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> get_component(Read<T> a, Int ncomps, Int comp) {
  Write<T> b(divide_no_remainder(a.size(), ncomps));
  auto f = OMEGA_H_LAMBDA(LO i) { b[i] = a[i * ncomps + comp]; };
  parallel_for(b.size(), f, "get_component");
  return b;
}